

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwk.h
# Opt level: O1

void Nwk_ManMarkFanins_rec(Nwk_Obj_t *pLut,int nLevMin)

{
  int iVar1;
  long lVar2;
  
  if (((((*(uint *)&pLut->field_0x20 & 7) == 3) &&
       (iVar1 = pLut->pMan->nTravIds, pLut->TravId != iVar1)) &&
      (pLut->TravId = iVar1, nLevMin <= pLut->Level)) && (0 < pLut->nFanins)) {
    lVar2 = 0;
    do {
      if (pLut->pFanio[lVar2] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManMarkFanins_rec(pLut->pFanio[lVar2],nLevMin);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pLut->nFanins);
  }
  return;
}

Assistant:

static inline int         Nwk_ObjIsNode( Nwk_Obj_t * p )          { return p->Type == NWK_OBJ_NODE;             }